

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZMHMixedMeshControl.cpp
# Opt level: O3

void __thiscall TPZMHMixedMeshControl::CreateHDivPressureMHMMesh(TPZMHMixedMeshControl *this)

{
  TPZCompMesh **ppTVar1;
  int iVar2;
  TPZGeoMesh *this_00;
  TPZCompMesh **ppTVar3;
  TPZCompMesh *pTVar4;
  TPZManVector<TPZCompMesh_*,_3> cmeshes;
  TPZManVector<TPZCompMesh_*,_3> local_a0;
  TPZManVector<TPZCompMesh_*,_3> local_68;
  
  TPZVec<TPZCompMesh_*>::TPZVec(&local_68.super_TPZVec<TPZCompMesh_*>,0);
  local_68.super_TPZVec<TPZCompMesh_*>._vptr_TPZVec = (_func_int **)&PTR__TPZManVector_019e0a80;
  ppTVar1 = local_68.fExtAlloc;
  local_68.super_TPZVec<TPZCompMesh_*>.fNElements = 2;
  local_68.super_TPZVec<TPZCompMesh_*>.fNAlloc = 0;
  pTVar4 = ((this->fFluxMesh).fRef)->fPointer;
  local_68.fExtAlloc[1] = ((this->super_TPZMHMeshControl).fPressureFineMesh.fRef)->fPointer;
  local_68.super_TPZVec<TPZCompMesh_*>.fStore = ppTVar1;
  local_68.fExtAlloc[0] = pTVar4;
  if (1 < (this->super_TPZMHMeshControl).fNState) {
    TPZManVector<TPZCompMesh_*,_3>::Resize(&local_68,3);
    ppTVar3 = local_68.super_TPZVec<TPZCompMesh_*>.fStore;
    local_68.super_TPZVec<TPZCompMesh_*>.fStore[2] = ((this->fRotationMesh).fRef)->fPointer;
    pTVar4 = *ppTVar3;
  }
  this_00 = pTVar4->fReference;
  if (this_00 == (TPZGeoMesh *)0x0) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"Geometric mesh doesn\'t exist",0x1c);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x58);
    std::ostream::put(-0x58);
    std::ostream::flush();
    pzinternal::DebugStopImpl
              ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Pre/TPZMHMixedMeshControl.cpp"
               ,0x239);
  }
  iVar2 = this_00->fDim;
  TPZGeoMesh::ResetReference(this_00);
  pTVar4 = ((this->super_TPZMHMeshControl).fCMesh.fRef)->fPointer;
  pTVar4->fDimModel = iVar2;
  TPZCreateApproximationSpace::SetAllCreateFunctionsMultiphysicElem(&pTVar4->fCreate);
  BuildMultiPhysicsMesh(this);
  TPZVec<TPZCompMesh_*>::TPZVec(&local_a0.super_TPZVec<TPZCompMesh_*>,0);
  local_a0.super_TPZVec<TPZCompMesh_*>._vptr_TPZVec = (_func_int **)&PTR__TPZManVector_019e0a80;
  local_a0.super_TPZVec<TPZCompMesh_*>.fNElements = 0;
  local_a0.super_TPZVec<TPZCompMesh_*>.fNAlloc = 0;
  local_a0.super_TPZVec<TPZCompMesh_*>.fStore = local_a0.fExtAlloc;
  TPZManVector<TPZCompMesh_*,_3>::operator=(&local_a0,&local_68);
  TPZMHMeshControl::JoinSubdomains
            (&this->super_TPZMHMeshControl,&local_a0.super_TPZVec<TPZCompMesh_*>,pTVar4);
  TPZBuildMultiphysicsMesh::TransferFromMeshes(&local_a0.super_TPZVec<TPZCompMesh_*>,pTVar4);
  (*(this->super_TPZMHMeshControl)._vptr_TPZMHMeshControl[0x14])
            (this,(ulong)(((this->super_TPZMHMeshControl).fGMesh.fRef)->fPointer->fDim - 1));
  (*(this->super_TPZMHMeshControl)._vptr_TPZMHMeshControl[0x14])
            (this,(ulong)(((this->super_TPZMHMeshControl).fGMesh.fRef)->fPointer->fDim - 2));
  (**(code **)(*(long *)pTVar4 + 0x88))(pTVar4);
  if (local_a0.super_TPZVec<TPZCompMesh_*>.fStore != local_a0.fExtAlloc) {
    local_a0.super_TPZVec<TPZCompMesh_*>.fNAlloc = 0;
    local_a0.super_TPZVec<TPZCompMesh_*>._vptr_TPZVec = (_func_int **)&PTR__TPZVec_018144b0;
    if (local_a0.super_TPZVec<TPZCompMesh_*>.fStore != (TPZCompMesh **)0x0) {
      operator_delete__(local_a0.super_TPZVec<TPZCompMesh_*>.fStore);
    }
  }
  if (local_68.super_TPZVec<TPZCompMesh_*>.fStore != ppTVar1) {
    local_68.super_TPZVec<TPZCompMesh_*>.fNAlloc = 0;
    local_68.super_TPZVec<TPZCompMesh_*>._vptr_TPZVec = (_func_int **)&PTR__TPZVec_018144b0;
    if (local_68.super_TPZVec<TPZCompMesh_*>.fStore != (TPZCompMesh **)0x0) {
      operator_delete__(local_68.super_TPZVec<TPZCompMesh_*>.fStore);
    }
  }
  return;
}

Assistant:

void TPZMHMixedMeshControl::CreateHDivPressureMHMMesh()
{
    TPZManVector<TPZCompMesh *,3 > cmeshes(2);
    cmeshes[0] = fFluxMesh.operator->();
    cmeshes[1] = fPressureFineMesh.operator->();
    
    if(0)
    {
        std::ofstream out("PressureMesh_MultiPhis.txt");
        cmeshes[1] ->Print(out);
        
        std::ofstream out2("FluxMesh_MultiPhis.txt");
        cmeshes[0] ->Print(out2);
    }
    
    
    if(fNState > 1) {
        cmeshes.Resize(3);
        cmeshes[2] = fRotationMesh.operator->();
    }
    TPZGeoMesh *gmesh = cmeshes[0]->Reference();
    if(!gmesh)
    {
        std::cout<< "Geometric mesh doesn't exist" << std::endl;
        DebugStop();
    }
    int dim = gmesh->Dimension();
    gmesh->ResetReference();
    // Multiphysics mesh
    TPZCompMesh * MixedFluxPressureCmesh = fCMesh.operator->();
    MixedFluxPressureCmesh->SetDimModel(dim);
    MixedFluxPressureCmesh->SetAllCreateFunctionsMultiphysicElem();
    
    BuildMultiPhysicsMesh();
    TPZManVector<TPZCompMesh * ,3> meshvector;
    
#ifdef PZDEBUG
    if(0)
    {
        std::ofstream out2("gmesh.txt");
        gmesh->Print(out2);
        std::ofstream out3("HDivMesh.txt");
        fFluxMesh->Print(out3);
        std::ofstream out4("PressureMesh.txt");
        fPressureFineMesh->Print(out4);
    }
#endif
    
    meshvector = cmeshes;

    // populate the connect to subdomain data structure for the multiphysics mesh
    JoinSubdomains(meshvector, MixedFluxPressureCmesh);
    
    // Transferindo para a multifisica
//    TPZBuildMultiphysicsMesh::AddElements(meshvector, MixedFluxPressureCmesh);
//    TPZBuildMultiphysicsMesh::AddConnects(meshvector, MixedFluxPressureCmesh);
    // copy the solution of the atomic meshes to the multiphysics mesh
    TPZBuildMultiphysicsMesh::TransferFromMeshes(meshvector, MixedFluxPressureCmesh);

    std::pair<int,int> skelmatid(fSkeletonMatId,fSecondSkeletonMatId);
    CreateMultiPhysicsInterfaceElements(fGMesh->Dimension()-1);
    CreateMultiPhysicsInterfaceElements(fGMesh->Dimension()-2);
#ifdef PZDEBUG
    if(0)
    {
        MixedFluxPressureCmesh->ComputeNodElCon();
        std::ofstream file("cmeshmphys.vtk");
        TPZVTKGeoMesh::PrintCMeshVTK(MixedFluxPressureCmesh, file,true);
        std::ofstream out("cmeshmphys.txt");
        MixedFluxPressureCmesh->Print(out);
    }
#endif
    MixedFluxPressureCmesh->CleanUpUnconnectedNodes();
    
#ifdef PZDEBUG
    if(0)
    {
        std::ofstream out("multiphysics.txt");
        MixedFluxPressureCmesh->Print(out);
    }
#endif
    
    return;
    
}